

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeWriter.cpp
# Opt level: O1

uint32 __thiscall
Js::WasmByteCodeWriter::WasmLoopStart
          (WasmByteCodeWriter *this,ByteCodeLabel loopEntrance,RegSlot *curRegs)

{
  Type *pTVar1;
  Data *this_00;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  Type pLVar6;
  code *pcVar7;
  RegSlot *curRegs_00;
  bool bVar8;
  uint32 loopId;
  undefined4 *puVar9;
  uint32 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  RegSlot local_44;
  RegSlot *local_40;
  uint local_34;
  
  local_40 = curRegs;
  local_34 = loopEntrance;
  loopId = FunctionBody::IncreaseCountField((this->super_ByteCodeWriter).m_functionWrite,LoopCount);
  if ((((this->super_ByteCodeWriter).m_loopHeaders)->
      super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
      ).count != loopId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/WasmByteCodeWriter.cpp"
                                ,0x2f,"((uint)m_loopHeaders->Count() == loopId)",
                                "(uint)m_loopHeaders->Count() == loopId");
    if (!bVar8) {
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar9 = 0;
  }
  this_01 = (this->super_ByteCodeWriter).m_loopHeaders;
  uVar3 = (this->super_ByteCodeWriter).m_byteCodeData.currentOffset;
  iVar4 = (this->super_ByteCodeWriter).m_loopNest;
  JsUtil::
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(this_01,0);
  pLVar6 = (this_01->
           super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
           ).buffer;
  iVar5 = (this_01->
          super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
          ).count;
  pLVar6[iVar5].isNested = 0 < iVar4;
  pLVar6[iVar5].startOffset = uVar3;
  pLVar6[iVar5].endOffset = 0;
  pLVar6[iVar5].hasYield = false;
  pTVar1 = &(this_01->
            super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
  *pTVar1 = *pTVar1 + 1;
  piVar2 = &(this->super_ByteCodeWriter).m_loopNest;
  *piVar2 = *piVar2 + 1;
  (*(this->super_IWasmByteCodeWriter)._vptr_IWasmByteCodeWriter[6])(this,(ulong)local_34);
  curRegs_00 = local_40;
  bVar8 = TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,WasmLoopBodyStart,loopId,local_40);
  if (!bVar8) {
    bVar8 = TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,WasmLoopBodyStart,loopId,curRegs_00);
    if (!bVar8) {
      this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
      local_54 = *(undefined8 *)curRegs_00;
      uStack_4c = *(undefined8 *)(curRegs_00 + 2);
      local_44 = curRegs_00[4];
      local_58 = loopId;
      ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>
                (this_00,WasmLoopBodyStart,&this->super_ByteCodeWriter,false);
      ByteCodeWriter::Data::Write(this_00,&local_58,0x18);
    }
  }
  return loopId;
}

Assistant:

uint32 WasmByteCodeWriter::WasmLoopStart(ByteCodeLabel loopEntrance, __in_ecount(WAsmJs::LIMIT) RegSlot* curRegs)
{
    uint loopId = m_functionWrite->IncrLoopCount();
    Assert((uint)m_loopHeaders->Count() == loopId);

    m_loopHeaders->Add(LoopHeaderData(m_byteCodeData.GetCurrentOffset(), 0, m_loopNest > 0, false));
    m_loopNest++;
    this->MarkAsmJsLabel(loopEntrance);
    MULTISIZE_LAYOUT_WRITE(WasmLoopStart, Js::OpCodeAsmJs::WasmLoopBodyStart, loopId, curRegs);

    return loopId;
}